

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

char * d_dup_pathname_str(char *s)

{
  size_t sVar1;
  bool bVar2;
  char *local_20;
  char *e;
  char *s_local;
  
  if (s == (char *)0x0) {
    s_local = dup_str("",(char *)0x0);
  }
  else if (*s == '\"') {
    local_20 = s + 1;
    while( true ) {
      bVar2 = false;
      if (*local_20 != '\0') {
        bVar2 = *local_20 != '\"';
      }
      if (!bVar2) break;
      local_20 = local_20 + 1;
    }
    s_local = dup_str(s + 1,local_20);
  }
  else {
    sVar1 = strlen(s);
    s_local = dup_str(s,s + sVar1);
  }
  return s_local;
}

Assistant:

char *d_dup_pathname_str(const char *s) {
  const char *e = s;
  if (!s) return dup_str("", 0);
  if (*e == '"') {
    e++;
    while (*e && *e != '"') e++;
    return dup_str(s + 1, e);
  } else
    return dup_str(s, s + strlen(s));
}